

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O3

void __thiscall
dg::llvmdg::DOD::DOD(DOD *this,Module *module,LLVMControlDependenceAnalysisOptions *opts)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  *this_00;
  pointer pcVar2;
  Module *pMVar3;
  ulong uVar4;
  long lVar5;
  size_type __bkt_count;
  LLVMControlDependenceAnalysisOptions local_90;
  
  paVar1 = &local_90.super_LLVMAnalysisOptions.entryFunction.field_2;
  pcVar2 = (opts->super_LLVMAnalysisOptions).entryFunction._M_dataplus._M_p;
  local_90.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,
             pcVar2 + (opts->super_LLVMAnalysisOptions).entryFunction._M_string_length);
  local_90.super_ControlDependenceAnalysisOptions.super_AnalysisOptions.fieldSensitivity =
       (opts->super_ControlDependenceAnalysisOptions).super_AnalysisOptions.fieldSensitivity;
  local_90.super_ControlDependenceAnalysisOptions.super_AnalysisOptions._1_7_ =
       *(undefined7 *)
        &(opts->super_ControlDependenceAnalysisOptions).super_AnalysisOptions.field_0x1;
  this_00 = &local_90.super_ControlDependenceAnalysisOptions.super_AnalysisOptions.
             allocationFunctions;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_Rb_tree(&this_00->_M_t,
             &(opts->super_ControlDependenceAnalysisOptions).super_AnalysisOptions.
              allocationFunctions._M_t);
  local_90.super_ControlDependenceAnalysisOptions.interprocedural =
       (opts->super_ControlDependenceAnalysisOptions).interprocedural;
  local_90.super_ControlDependenceAnalysisOptions.algorithm =
       (opts->super_ControlDependenceAnalysisOptions).algorithm;
  local_90.super_ControlDependenceAnalysisOptions._61_2_ =
       *(undefined2 *)&(opts->super_ControlDependenceAnalysisOptions).field_0x3d;
  LLVMControlDependenceAnalysisImpl::LLVMControlDependenceAnalysisImpl
            (&this->super_LLVMControlDependenceAnalysisImpl,module,&local_90);
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_M_erase(&this_00->_M_t,
             (_Link_type)
             local_90.super_ControlDependenceAnalysisOptions.super_AnalysisOptions.
             allocationFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p,
                    local_90.super_LLVMAnalysisOptions.entryFunction.field_2._M_allocated_capacity +
                    1);
  }
  (this->super_LLVMControlDependenceAnalysisImpl)._vptr_LLVMControlDependenceAnalysisImpl =
       (_func_int **)&PTR__DOD_00146c20;
  *(undefined8 *)&(this->graphBuilder)._nodes._M_h._M_rehash_policy = 0;
  (this->graphBuilder)._nodes._M_h._M_rehash_policy._M_next_resize = 0;
  (this->graphBuilder)._nodes._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->graphBuilder)._rev_mapping._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->graphBuilder)._rev_mapping._M_h._M_bucket_count = 0;
  (this->graphBuilder)._rev_mapping._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->graphBuilder)._rev_mapping._M_h._M_element_count = 0;
  *(undefined8 *)&(this->graphBuilder)._rev_mapping._M_h._M_rehash_policy = 0;
  (this->graphBuilder)._nodes._M_h._M_buckets = &(this->graphBuilder)._nodes._M_h._M_single_bucket;
  (this->graphBuilder)._nodes._M_h._M_bucket_count = 1;
  (this->graphBuilder)._nodes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->graphBuilder)._nodes._M_h._M_element_count = 0;
  (this->graphBuilder)._nodes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->graphBuilder)._nodes._M_h._M_rehash_policy._M_next_resize = 0;
  (this->graphBuilder)._nodes._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->graphBuilder)._rev_mapping._M_h._M_buckets =
       &(this->graphBuilder)._rev_mapping._M_h._M_single_bucket;
  (this->graphBuilder)._rev_mapping._M_h._M_bucket_count = 1;
  (this->graphBuilder)._rev_mapping._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->graphBuilder)._rev_mapping._M_h._M_element_count = 0;
  (this->graphBuilder)._rev_mapping._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->graphBuilder)._rev_mapping._M_h._M_rehash_policy._M_next_resize = 0;
  (this->graphBuilder)._rev_mapping._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->_graphs)._M_h._M_buckets = &(this->_graphs)._M_h._M_single_bucket;
  (this->_graphs)._M_h._M_bucket_count = 1;
  (this->_graphs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_graphs)._M_h._M_element_count = 0;
  (this->_graphs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_graphs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_graphs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pMVar3 = *(Module **)(module + 0x20);
  if (pMVar3 == module + 0x18) {
    __bkt_count = 0;
  }
  else {
    lVar5 = 0;
    do {
      pMVar3 = *(Module **)(pMVar3 + 8);
      lVar5 = lVar5 + 1;
    } while (pMVar3 != module + 0x18);
    uVar4 = (ulong)(double)lVar5;
    __bkt_count = (long)((double)lVar5 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
  }
  std::
  _Hashtable<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::DOD::Info>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::DOD::Info>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Function_*>,_std::hash<const_llvm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash(&(this->_graphs)._M_h,__bkt_count);
  return;
}

Assistant:

DOD(const llvm::Module *module,
        const LLVMControlDependenceAnalysisOptions &opts = {})
            : LLVMControlDependenceAnalysisImpl(module, opts) {
        _graphs.reserve(module->size());
    }